

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O2

void pybind11::detail::enable_dynamic_attributes(PyHeapTypeObject *heap_type)

{
  byte *pbVar1;
  long lVar2;
  
  pbVar1 = (byte *)((long)&(heap_type->ht_type).tp_flags + 1);
  *pbVar1 = *pbVar1 | 0x40;
  lVar2 = (heap_type->ht_type).tp_basicsize;
  (heap_type->ht_type).tp_dictoffset = lVar2;
  (heap_type->ht_type).tp_basicsize = lVar2 + 8;
  (heap_type->ht_type).tp_traverse = pybind11_traverse;
  (heap_type->ht_type).tp_clear = pybind11_clear;
  (heap_type->ht_type).tp_getset = enable_dynamic_attributes::getset;
  return;
}

Assistant:

inline void enable_dynamic_attributes(PyHeapTypeObject *heap_type) {
    auto type = &heap_type->ht_type;
#if defined(PYPY_VERSION) && (PYPY_VERSION_NUM < 0x06000000)
    pybind11_fail(std::string(type->tp_name) + ": dynamic attributes are "
                                               "currently not supported in "
                                               "conjunction with PyPy!");
#endif
    type->tp_flags |= Py_TPFLAGS_HAVE_GC;
    type->tp_dictoffset = type->tp_basicsize; // place dict at the end
    type->tp_basicsize += (ssize_t)sizeof(PyObject *); // and allocate enough space for it
    type->tp_traverse = pybind11_traverse;
    type->tp_clear = pybind11_clear;

    static PyGetSetDef getset[] = {
        {const_cast<char*>("__dict__"), pybind11_get_dict, pybind11_set_dict, nullptr, nullptr},
        {nullptr, nullptr, nullptr, nullptr, nullptr}
    };
    type->tp_getset = getset;
}